

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O0

bool __thiscall mjs::gc_heap::type_check<mjs::function_object>(gc_heap *this,uint32_t pos)

{
  bool bVar1;
  slot *psVar2;
  gc_type_info *this_00;
  long local_38;
  bool local_1d;
  slot local_1c;
  slot_allocation_header a;
  uint32_t pos_local;
  gc_heap *this_local;
  
  a.size = pos;
  unique0x100000a5 = this;
  psVar2 = get_at(this,pos - 1);
  local_1c = *psVar2;
  this_00 = slot_allocation_header::type_info(&local_1c.allocation);
  bVar1 = gc_type_info::is_convertible_to_object(this_00);
  local_1d = false;
  if (bVar1) {
    psVar2 = get_at(this,a.size);
    if (psVar2 == (slot *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = __dynamic_cast(psVar2,&object::typeinfo,&function_object::typeinfo,0);
    }
    local_1d = local_38 != 0;
  }
  return local_1d;
}

Assistant:

bool type_check(uint32_t pos) const {
        const auto a = get_at(pos-1)->allocation;
        if constexpr (std::is_convertible_v<T*, object*>) {
            // Avoid creating gc_type_info_registration<T>'s for interface types
            return a.type_info().is_convertible_to_object() && dynamic_cast<T*>(reinterpret_cast<object*>(get_at(pos)));
        } else {
            return gc_type_info_registration<T>::index()  == a.type;
        }
    }